

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

QSize __thiscall QListView::viewportSizeHint(QListView *this)

{
  int iVar1;
  QAbstractItemModel *pQVar2;
  bool bVar3;
  int iVar4;
  QListViewPrivate *this_00;
  int *piVar5;
  long *in_RDI;
  long in_FS_OFFSET;
  int row;
  int h;
  int rowCount;
  QListViewPrivate *d;
  QSize itemSize;
  QModelIndex idx_1;
  int w;
  int maximumRows;
  QModelIndex idx;
  int rc;
  QSize sz;
  QStyleOptionViewItem option;
  QVariant userOverrideValue;
  int in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  QStyleOptionViewItem *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  undefined4 in_stack_fffffffffffffe40;
  int iVar6;
  int iVar7;
  undefined4 in_stack_fffffffffffffe44;
  int iVar8;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  int local_19c;
  QSize local_198;
  QPersistentModelIndex local_190 [3];
  undefined1 *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  int local_160;
  int local_15c;
  QSize local_158;
  QPersistentModelIndex local_150 [3];
  undefined1 *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  undefined1 local_120 [28];
  int local_104;
  QSize local_100;
  undefined1 local_f8 [208];
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QListView *)0x888070);
  if ((this_00->super_QAbstractItemViewPrivate).model == (QAbstractItemModel *)0x0) {
    local_100 = QAbstractItemView::viewportSizeHint
                          ((QAbstractItemView *)
                           CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  }
  else {
    pQVar2 = (this_00->super_QAbstractItemViewPrivate).model;
    QModelIndex::QModelIndex((QModelIndex *)0x8880b9);
    local_104 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,local_120);
    if ((local_104 == 0) || (bVar3 = isWrapping((QListView *)in_stack_fffffffffffffe00), bVar3)) {
      local_100 = QAbstractItemView::viewportSizeHint
                            ((QAbstractItemView *)
                             CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    }
    else {
      memset(local_f8,0xaa,0xd0);
      QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)0x888128);
      (**(code **)(*in_RDI + 0x2f8))(in_RDI,local_f8);
      bVar3 = uniformItemSizes((QListView *)in_stack_fffffffffffffe00);
      if (bVar3) {
        local_100 = this_00->cachedItemSize;
        bVar3 = QSize::isValid((QSize *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10
                                                ));
        if (!bVar3) {
          local_138 = &DAT_aaaaaaaaaaaaaaaa;
          local_130 = &DAT_aaaaaaaaaaaaaaaa;
          local_128 = &DAT_aaaaaaaaaaaaaaaa;
          pQVar2 = (this_00->super_QAbstractItemViewPrivate).model;
          iVar4 = this_00->column;
          QPersistentModelIndex::operator_cast_to_QModelIndex(local_150);
          (**(code **)(*(long *)pQVar2 + 0x60))(&local_138,pQVar2,0,iVar4,local_150);
          local_158 = QListViewPrivate::itemSize
                                (this_00,(QStyleOptionViewItem *)
                                         CONCAT44(in_stack_fffffffffffffe4c,
                                                  in_stack_fffffffffffffe48),
                                 (QModelIndex *)
                                 CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
          local_100 = local_158;
        }
        QSize::height((QSize *)0x88825a);
        QSize::setHeight((QSize *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
      }
      else {
        local_15c = 1000;
        local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_10 = &DAT_aaaaaaaaaaaaaaaa;
        QObject::property((char *)local_28.data);
        bVar3 = ::QVariant::isValid((QVariant *)in_stack_fffffffffffffe00);
        if ((bVar3) && (iVar4 = ::QVariant::toInt((bool *)local_28.data), 0 < iVar4)) {
          local_15c = ::QVariant::toInt((bool *)local_28.data);
        }
        piVar5 = qMin<int>(&local_104,&local_15c);
        iVar4 = *piVar5;
        iVar8 = 0;
        local_160 = 0;
        iVar6 = 0;
        while (iVar6 < iVar4) {
          local_178 = &DAT_aaaaaaaaaaaaaaaa;
          local_170 = &DAT_aaaaaaaaaaaaaaaa;
          local_168 = &DAT_aaaaaaaaaaaaaaaa;
          pQVar2 = (this_00->super_QAbstractItemViewPrivate).model;
          iVar1 = this_00->column;
          iVar7 = iVar6;
          QPersistentModelIndex::operator_cast_to_QModelIndex(local_190);
          (**(code **)(*(long *)pQVar2 + 0x60))(&local_178,pQVar2,iVar6,iVar1,local_190);
          local_198 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
          local_198 = QListViewPrivate::itemSize
                                (this_00,(QStyleOptionViewItem *)
                                         CONCAT44(in_stack_fffffffffffffe4c,iVar4),
                                 (QModelIndex *)CONCAT44(iVar8,iVar7));
          iVar6 = QSize::height((QSize *)0x888420);
          iVar8 = iVar6 + iVar8;
          local_19c = QSize::width((QSize *)0x888432);
          piVar5 = qMax<int>(&local_160,&local_19c);
          local_160 = *piVar5;
          iVar6 = iVar7 + 1;
        }
        QSize::QSize((QSize *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,
                     in_stack_fffffffffffffdf8);
        ::QVariant::~QVariant((QVariant *)&local_28);
      }
      QStyleOptionViewItem::~QStyleOptionViewItem(in_stack_fffffffffffffe00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_100;
}

Assistant:

QSize QListView::viewportSizeHint() const
{
    Q_D(const QListView);
    // We don't have a nice simple size hint for invalid or wrapping list views.
    if (!d->model)
        return QAbstractItemView::viewportSizeHint();
    const int rc = d->model->rowCount();
    if (rc == 0 || isWrapping())
        return QAbstractItemView::viewportSizeHint();

    QStyleOptionViewItem option;
    initViewItemOption(&option);

    if (uniformItemSizes()) {
        QSize sz = d->cachedItemSize;
        if (!sz.isValid()) {
            QModelIndex idx = d->model->index(0, d->column, d->root);
            sz = d->itemSize(option, idx);
        }
        sz.setHeight(rc * sz.height());
        return sz;
    }

    // Using AdjustToContents with a high number of rows will normally not make sense, so we limit
    // this to default 1000 (that is btw the default for QHeaderView::resizeContentsPrecision())
    // (By setting the property _q_resizeContentPrecision the user can however override this).
    int maximumRows = 1000;
    const QVariant userOverrideValue = property("_q_resizeContentPrecision");
    if (userOverrideValue.isValid() && userOverrideValue.toInt() > 0) {
      maximumRows = userOverrideValue.toInt();
    }
    const int rowCount = qMin(rc, maximumRows);

    int h = 0;
    int w = 0;

    for (int row = 0; row < rowCount; ++row) {
        QModelIndex idx = d->model->index(row, d->column, d->root);
        QSize itemSize = d->itemSize(option, idx);
        h += itemSize.height();
        w = qMax(w, itemSize.width());
    }
    return QSize(w, h);
}